

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pullpush.c
# Opt level: O0

void pull_subfield_end(uchar **cursor,size_t *max,uchar *subcursor,size_t submax)

{
  uchar *puVar1;
  uchar *subend;
  size_t submax_local;
  uchar *subcursor_local;
  size_t *max_local;
  uchar **cursor_local;
  
  if (subcursor == (uchar *)0x0) {
    pull_failed(cursor,max);
  }
  else if (*cursor != (uchar *)0x0) {
    puVar1 = subcursor + submax;
    if (subcursor < *cursor) {
      __assert_fail("subcursor >= *cursor",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/libwally-core/src/pullpush.c"
                    ,0xb4,
                    "void pull_subfield_end(const unsigned char **, size_t *, const unsigned char *, size_t)"
                   );
    }
    if (*cursor + *max < puVar1) {
      __assert_fail("subend <= *cursor + *max",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/libwally-core/src/pullpush.c"
                    ,0xb5,
                    "void pull_subfield_end(const unsigned char **, size_t *, const unsigned char *, size_t)"
                   );
    }
    *max = *max - ((long)puVar1 - (long)*cursor);
    *cursor = puVar1;
  }
  return;
}

Assistant:

void pull_subfield_end(const unsigned char **cursor, size_t *max,
                       const unsigned char *subcursor, size_t submax)
{
    if (subcursor == NULL) {
        pull_failed(cursor, max);
    } else if (*cursor != NULL) {
        const unsigned char *subend = subcursor + submax;
        assert(subcursor >= *cursor);
        assert(subend <= *cursor + *max);
        *max -= (subend - *cursor);
        *cursor = subend;
    }
}